

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

void __thiscall Fl_Text_Buffer::text(Fl_Text_Buffer *this,char *t)

{
  char *__s;
  char *__dest;
  char *pcVar1;
  int iVar2;
  int nDeleted;
  long lVar3;
  size_t sVar4;
  
  __s = "";
  if (t != (char *)0x0) {
    __s = t;
  }
  nDeleted = this->mLength;
  if (0 < this->mNPredeleteProcs) {
    lVar3 = 0;
    do {
      (*this->mPredeleteProcs[lVar3])(0,nDeleted,this->mPredeleteCbArgs[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->mNPredeleteProcs);
    nDeleted = this->mLength;
  }
  __dest = (char *)malloc((long)(nDeleted + 1));
  pcVar1 = this->mBuf;
  sVar4 = (size_t)this->mGapStart;
  memcpy(__dest,pcVar1,sVar4);
  memcpy(__dest + sVar4,pcVar1 + this->mGapEnd,(long)nDeleted - sVar4);
  __dest[nDeleted] = '\0';
  free(pcVar1);
  sVar4 = strlen(__s);
  iVar2 = (int)sVar4;
  sVar4 = (long)this->mPreferredGapSize + (long)iVar2;
  pcVar1 = (char *)malloc(sVar4);
  this->mBuf = pcVar1;
  this->mLength = iVar2;
  this->mGapStart = iVar2;
  this->mGapEnd = (int)sVar4;
  memcpy(pcVar1,__s,(long)iVar2);
  update_selections(this,0,nDeleted,0);
  if (0 < this->mNModifyProcs) {
    lVar3 = 0;
    do {
      (*this->mModifyProcs[lVar3])(0,iVar2,nDeleted,0,__dest,this->mCbArgs[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->mNModifyProcs);
  }
  free(__dest);
  return;
}

Assistant:

void Fl_Text_Buffer::text(const char *t)
{
  IS_UTF8_ALIGNED(t)

  // if t is null then substitute it with an empty string
  // then don't return so that internal cleanup can happen
  if (!t) t="";

  call_predelete_callbacks(0, length());
  
  /* Save information for redisplay, and get rid of the old buffer */
  const char *deletedText = text();
  int deletedLength = mLength;
  free((void *) mBuf);
  
  /* Start a new buffer with a gap of mPreferredGapSize at the end */
  int insertedLength = (int) strlen(t);
  mBuf = (char *) malloc(insertedLength + mPreferredGapSize);
  mLength = insertedLength;
  mGapStart = insertedLength;
  mGapEnd = mGapStart + mPreferredGapSize;
  memcpy(mBuf, t, insertedLength);
  
  /* Zero all of the existing selections */
  update_selections(0, deletedLength, 0);
  
  /* Call the saved display routine(s) to update the screen */
  call_modify_callbacks(0, deletedLength, insertedLength, 0, deletedText);
  free((void *) deletedText);
}